

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

cgltf_component_type cgltf_json_to_component_type(jsmntok_t *tok,uint8_t *json_chunk)

{
  int iVar1;
  int type;
  uint8_t *json_chunk_local;
  jsmntok_t *tok_local;
  
  iVar1 = cgltf_json_to_int(tok,json_chunk);
  switch(iVar1) {
  case 0x1400:
    tok_local._4_4_ = cgltf_component_type_r_8;
    break;
  case 0x1401:
    tok_local._4_4_ = cgltf_component_type_r_8u;
    break;
  case 0x1402:
    tok_local._4_4_ = cgltf_component_type_r_16;
    break;
  case 0x1403:
    tok_local._4_4_ = cgltf_component_type_r_16u;
    break;
  default:
    tok_local._4_4_ = cgltf_component_type_invalid;
    break;
  case 0x1405:
    tok_local._4_4_ = cgltf_component_type_r_32u;
    break;
  case 0x1406:
    tok_local._4_4_ = cgltf_component_type_r_32f;
  }
  return tok_local._4_4_;
}

Assistant:

static cgltf_component_type cgltf_json_to_component_type(jsmntok_t const* tok, const uint8_t* json_chunk)
{
	int type = cgltf_json_to_int(tok, json_chunk);

	switch (type)
	{
	case 5120:
		return cgltf_component_type_r_8;
	case 5121:
		return cgltf_component_type_r_8u;
	case 5122:
		return cgltf_component_type_r_16;
	case 5123:
		return cgltf_component_type_r_16u;
	case 5125:
		return cgltf_component_type_r_32u;
	case 5126:
		return cgltf_component_type_r_32f;
	default:
		return cgltf_component_type_invalid;
	}
}